

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderEms.cpp
# Opt level: O3

HighsStatus __thiscall
FilereaderEms::writeModelToFile
          (FilereaderEms *this,HighsOptions *options,string *filename,HighsModel *model)

{
  double dVar1;
  uint uVar2;
  long *plVar3;
  ostream *poVar4;
  pointer pbVar5;
  long lVar6;
  ulong uVar7;
  ofstream f;
  undefined1 local_230 [8];
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)local_230);
  std::ofstream::open((string *)local_230,(_Ios_Openmode)filename);
  uVar2 = (model->lp_).a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(model->lp_).num_col_];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"n_rows",6);
  std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  plVar3 = (long *)std::ostream::operator<<(local_230,(model->lp_).num_row_);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"n_columns",9);
  std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  plVar3 = (long *)std::ostream::operator<<(local_230,(model->lp_).num_col_);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"n_matrix_elements",0x11);
  std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  plVar3 = (long *)std::ostream::operator<<(local_230,uVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"matrix",6);
  std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  if (-1 < (model->lp_).num_col_) {
    lVar6 = -1;
    do {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (local_230,
                          (model->lp_).a_matrix_.start_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6 + 1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (model->lp_).num_col_);
  }
  std::ios::widen((char)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (local_230,
                          (model->lp_).a_matrix_.index_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  std::ios::widen((char)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  *(undefined8 *)(local_228 + (long)*(_func_int **)((long)local_230 + -0x18)) = 9;
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      poVar4 = std::ostream::_M_insert<double>
                         ((model->lp_).a_matrix_.value_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  std::ios::widen((char)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  *(undefined8 *)(local_228 + (long)*(_func_int **)((long)local_230 + -0x18)) = 9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"column_bounds",0xd);
  std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  if (0 < (model->lp_).num_col_) {
    lVar6 = 0;
    do {
      poVar4 = std::ostream::_M_insert<double>
                         ((model->lp_).col_lower_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (model->lp_).num_col_);
  }
  std::ios::widen((char)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  if (0 < (model->lp_).num_col_) {
    lVar6 = 0;
    do {
      poVar4 = std::ostream::_M_insert<double>
                         ((model->lp_).col_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (model->lp_).num_col_);
  }
  std::ios::widen((char)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"row_bounds",10);
  std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  *(undefined8 *)(local_228 + (long)*(_func_int **)((long)local_230 + -0x18)) = 9;
  if (0 < (model->lp_).num_row_) {
    lVar6 = 0;
    do {
      poVar4 = std::ostream::_M_insert<double>
                         ((model->lp_).row_lower_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (model->lp_).num_row_);
  }
  std::ios::widen((char)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  if (0 < (model->lp_).num_row_) {
    lVar6 = 0;
    do {
      poVar4 = std::ostream::_M_insert<double>
                         ((model->lp_).row_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (model->lp_).num_row_);
  }
  std::ios::widen((char)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"column_costs",0xc);
  std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  if (0 < (model->lp_).num_col_) {
    lVar6 = 0;
    do {
      poVar4 = std::ostream::_M_insert<double>
                         ((double)(model->lp_).sense_ *
                          (model->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (model->lp_).num_col_);
  }
  std::ios::widen((char)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  if (((model->lp_).row_names_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       (model->lp_).row_names_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start) &&
     ((model->lp_).col_names_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->lp_).col_names_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"names",5);
    std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
    std::ostream::put((char)local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"columns",7);
    std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
    std::ostream::put((char)local_230);
    std::ostream::flush();
    pbVar5 = (model->lp_).col_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((model->lp_).col_names_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
      lVar6 = 8;
      uVar7 = 0;
      do {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,*(char **)((long)pbVar5 + lVar6 + -8),
                            *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar6));
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        uVar7 = uVar7 + 1;
        pbVar5 = (model->lp_).col_names_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x20;
      } while (uVar7 < (ulong)((long)(model->lp_).col_names_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)
              );
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"rows",4);
    std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
    std::ostream::put((char)local_230);
    std::ostream::flush();
    pbVar5 = (model->lp_).row_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((model->lp_).row_names_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
      lVar6 = 8;
      uVar7 = 0;
      do {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,*(char **)((long)pbVar5 + lVar6 + -8),
                            *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar6));
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        uVar7 = uVar7 + 1;
        pbVar5 = (model->lp_).row_names_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x20;
      } while (uVar7 < (ulong)((long)(model->lp_).row_names_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)
              );
    }
  }
  dVar1 = (model->lp_).offset_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"shift",5);
    std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
    std::ostream::put((char)local_230);
    std::ostream::flush();
    poVar4 = std::ostream::_M_insert<double>((double)(model->lp_).sense_ * (model->lp_).offset_);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  std::ios::widen((char)local_230 + (char)*(_func_int **)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  std::ofstream::close();
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + (long)_VTT[-3]) = _strtod;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return kOk;
}

Assistant:

HighsStatus FilereaderEms::writeModelToFile(const HighsOptions& options,
                                            const std::string filename,
                                            const HighsModel& model) {
  std::ofstream f;
  f.open(filename, std::ios::out);
  const HighsLp& lp = model.lp_;
  HighsInt num_nz = lp.a_matrix_.start_[lp.num_col_];

  // counts
  f << "n_rows" << std::endl;
  f << lp.num_row_ << std::endl;
  f << "n_columns" << std::endl;
  f << lp.num_col_ << std::endl;
  f << "n_matrix_elements" << std::endl;
  f << num_nz << std::endl;

  // matrix
  f << "matrix" << std::endl;
  for (HighsInt i = 0; i < lp.num_col_ + 1; i++)
    f << lp.a_matrix_.start_[i] << " ";
  f << std::endl;

  for (HighsInt i = 0; i < num_nz; i++) f << lp.a_matrix_.index_[i] << " ";
  f << std::endl;

  f << std::setprecision(9);
  for (HighsInt i = 0; i < num_nz; i++) f << lp.a_matrix_.value_[i] << " ";
  f << std::endl;

  // cost and bounds
  f << std::setprecision(9);

  f << "column_bounds" << std::endl;
  for (HighsInt i = 0; i < lp.num_col_; i++) f << lp.col_lower_[i] << " ";
  f << std::endl;

  for (HighsInt i = 0; i < lp.num_col_; i++) f << lp.col_upper_[i] << " ";
  f << std::endl;

  f << "row_bounds" << std::endl;
  f << std::setprecision(9);
  for (HighsInt i = 0; i < lp.num_row_; i++) f << lp.row_lower_[i] << " ";
  f << std::endl;

  for (HighsInt i = 0; i < lp.num_row_; i++) f << lp.row_upper_[i] << " ";
  f << std::endl;

  f << "column_costs" << std::endl;
  for (HighsInt i = 0; i < lp.num_col_; i++)
    f << (HighsInt)lp.sense_ * lp.col_cost_[i] << " ";
  f << std::endl;

  if (lp.row_names_.size() > 0 && lp.col_names_.size() > 0) {
    f << "names" << std::endl;

    f << "columns" << std::endl;
    for (size_t i = 0; i < lp.col_names_.size(); i++)
      f << lp.col_names_[i] << std::endl;

    f << "rows" << std::endl;
    for (size_t i = 0; i < lp.row_names_.size(); i++)
      f << lp.row_names_[i] << std::endl;
  }

  // todo: integer variables.

  if (lp.offset_ != 0)
    f << "shift" << std::endl << (HighsInt)lp.sense_ * lp.offset_ << std::endl;

  f << std::endl;
  f.close();
  return HighsStatus::kOk;
}